

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O1

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,string_view name)

{
  bool bVar1;
  int iVar2;
  Translator **ppTVar3;
  Translator *pTVar4;
  int iVar5;
  Translator **ppTVar6;
  long lVar7;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> tran;
  pthread_rwlock_t *local_50;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> local_48;
  
  bVar1 = (this->translators).enabled;
  if (bVar1 == true) {
    local_50 = (pthread_rwlock_t *)&(this->translators).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_50->__data);
  }
  else {
    local_50 = (pthread_rwlock_t *)0x0;
  }
  gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::find
            (&local_48,&(this->translators).m_obj,name);
  iVar2 = (this->translators).m_obj.dataStorage.bsize;
  ppTVar6 = (this->translators).m_obj.dataStorage.dataptr;
  lVar7 = (long)(this->translators).m_obj.dataStorage.dataSlotIndex;
  if (bVar1 != false) {
    pthread_rwlock_unlock(local_50);
  }
  if (ppTVar6 == (Translator **)0x0) {
    ppTVar3 = &gmlc::containers::
               StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::end::
               emptyValue;
  }
  else {
    ppTVar3 = ppTVar6 + lVar7 + 1;
  }
  ppTVar6 = ppTVar6 + lVar7;
  if (iVar2 == 0x20) {
    ppTVar6 = ppTVar3;
  }
  iVar5 = 0;
  if (iVar2 != 0x20) {
    iVar5 = iVar2;
  }
  pTVar4 = (Translator *)invalidTran;
  if (local_48.vec != ppTVar6) {
    pTVar4 = local_48.ptr;
  }
  if (local_48.offset != iVar5) {
    pTVar4 = local_48.ptr;
  }
  return pTVar4;
}

Assistant:

const Translator& ConnectorFederateManager::getTranslator(std::string_view name) const
{
    auto sharedTran = translators.lock_shared();
    auto tran = sharedTran->find(name);
    return (tran != sharedTran.end()) ? (*tran) : invalidTran;
}